

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O3

Option<const_int_&> __thiscall
Lib::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_Lib::DefaultHash>
::tryGet(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_Lib::DefaultHash>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  char cVar5;
  uint *puVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  uint *puVar7;
  uint uVar8;
  uint *puVar9;
  uint *puVar10;
  
  pcVar4 = (in_RDX->_M_dataplus)._M_p;
  cVar5 = *pcVar4;
  if (cVar5 == '\0') {
    uVar8 = 0x811c9dc5;
  }
  else {
    uVar8 = 0x811c9dc5;
    do {
      pcVar4 = pcVar4 + 1;
      uVar8 = ((int)cVar5 ^ uVar8) * 0x1000193;
      cVar5 = *pcVar4;
    } while (cVar5 != '\0');
  }
  uVar8 = uVar8 + (uVar8 == 0);
  puVar6 = (uint *)key->_M_string_length;
  puVar9 = (uint *)0x0;
  uVar1 = (ulong)uVar8 % (ulong)*(uint *)&(key->_M_dataplus)._M_p;
  uVar3 = puVar6[uVar1 * 0xc];
  if (uVar3 != 0) {
    puVar7 = puVar6 + uVar1 * 0xc;
    puVar9 = (uint *)0x0;
    do {
      if (uVar3 == uVar8) {
        bVar2 = DefaultHash::equals<std::__cxx11::string>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (puVar7 + 2),in_RDX);
        if (bVar2) {
          puVar9 = puVar7 + 10;
          break;
        }
        puVar6 = (uint *)key->_M_string_length;
      }
      puVar10 = puVar7 + 0xc;
      puVar7 = puVar6;
      if (puVar10 != (uint *)(key->field_2)._M_allocated_capacity) {
        puVar7 = puVar10;
      }
      uVar3 = *puVar7;
    } while (uVar3 != 0);
  }
  *(uint **)this = puVar9;
  return (OptionBase<const_int_&>)(OptionBase<const_int_&>)this;
}

Assistant:

Option<Val const&> tryGet(Key const& key) const
  {
    using Opt = Option<Val const&>;

    auto code = hashCode(key);
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return Opt(entry->value());
      }
    }

    return Opt();
  }